

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O1

void __thiscall
embree::XMLWriter::store_array_text<int>
          (XMLWriter *this,char *name,vector<int,_std::allocator<int>_> *vec)

{
  int __oflag;
  ulong uVar1;
  ulong uVar2;
  allocator local_79;
  char *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  std::__cxx11::string::string((string *)local_50,name,&local_79);
  open(this,(char *)local_50,__oflag);
  local_78 = name;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if ((vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_start) {
    uVar1 = 0;
    do {
      if (this->ident != 0) {
        uVar2 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10," ",1);
          uVar2 = uVar2 + 1;
        } while (uVar2 < this->ident);
      }
      store_array_elt(this,(vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + uVar1);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (ulong)((long)(vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
  }
  std::__cxx11::string::string((string *)local_70,local_78,&local_79);
  close(this,(int)local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return;
}

Assistant:

void XMLWriter::store_array_text(const char* name, const std::vector<T>& vec)
  {
    open(name);
    for (size_t i=0; i<vec.size(); i++) {
      tab(); store_array_elt(vec[i]);
    }
    close(name);
  }